

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_tests.cpp
# Opt level: O0

void (anonymous_namespace)::test_concat<true,5>(uint32_t sz)

{
  int val;
  const_reference piVar1;
  int val2;
  int val1;
  int val_cat;
  uint32_t j;
  vector<int,_true,_5> catted;
  vector<int,_true,_5> local_38;
  uint local_30;
  uint32_t i;
  vector<int,_true,_5> local_20;
  vector<int,_true,_5> v2;
  vector<int,_true,_5> v1;
  uint32_t sz_local;
  
  immutable::vector<int,_true,_5>::vector(&v2);
  immutable::vector<int,_true,_5>::vector(&local_20);
  for (local_30 = 0; local_30 < sz; local_30 = local_30 + 1) {
    rand();
    immutable::vector<int,_true,_5>::push_back(&local_38,(value_type)&v2);
    immutable::vector<int,_true,_5>::operator=(&v2,&local_38);
    immutable::vector<int,_true,_5>::~vector(&local_38);
    rand();
    immutable::vector<int,_true,_5>::push_back(&catted,(value_type)&local_20);
    immutable::vector<int,_true,_5>::operator=(&local_20,&catted);
    immutable::vector<int,_true,_5>::~vector(&catted);
    immutable::operator+((immutable *)&val_cat,&v2,&local_20);
    for (val1 = 0; (uint)val1 < (local_30 + 1) * 2; val1 = val1 + 1) {
      piVar1 = immutable::vector<int,_true,_5>::operator[]((vector<int,_true,_5> *)&val_cat,val1);
      val = *piVar1;
      if (local_30 < (uint)val1) {
        piVar1 = immutable::vector<int,_true,_5>::operator[](&local_20,~local_30 + val1);
        TestEq<int,int>(*piVar1,val,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x123,
                        "void (anonymous namespace)::test_concat(uint32_t) [atomic_ref_counting = true, N = 5]"
                       );
      }
      else {
        piVar1 = immutable::vector<int,_true,_5>::operator[](&v2,val1);
        TestEq<int,int>(*piVar1,val,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x11e,
                        "void (anonymous namespace)::test_concat(uint32_t) [atomic_ref_counting = true, N = 5]"
                       );
      }
    }
    immutable::vector<int,_true,_5>::~vector((vector<int,_true,_5> *)&val_cat);
  }
  immutable::vector<int,_true,_5>::~vector(&local_20);
  immutable::vector<int,_true,_5>::~vector(&v2);
  return;
}

Assistant:

void test_concat(uint32_t sz = 2000)
    {
    immutable::vector<int, atomic_ref_counting, N> v1;
    immutable::vector<int, atomic_ref_counting, N> v2;
    for (uint32_t i = 0; i < sz; ++i)
      {
      v1 = v1.push_back((int)rand());
      v2 = v2.push_back((int)rand());

      immutable::vector<int, atomic_ref_counting, N> catted = v1 + v2;

      for (uint32_t j = 0; j < (i + 1) * 2; j++)
        {
        int val_cat = catted[j];
        if (j <= i)
          {
          int val1 = v1[j];
          TEST_EQ(val1, val_cat);
          }
        else
          {
          int val2 = v2[j - i - 1];
          TEST_EQ(val2, val_cat);
          }
        }
      }
    }